

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O0

void run_andnot_test(void)

{
  int iVar1;
  array_container_t *array;
  bitset_container_t *bitset;
  bitset_container_t *bitset_00;
  bitset_container_t *bitset_01;
  bitset_container_t *bitset_02;
  bitset_container_t *bitset_03;
  array_container_t *src_1;
  array_container_t *src_2;
  array_container_t *src_1_00;
  container_t **dst;
  run_container_t *src_2_00;
  run_container_t *src_1_01;
  int card_4_3;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  array_container_t *temp_ac;
  run_container_t *R_small_complex;
  int i_1;
  run_container_t *R_small;
  int i;
  array_container_t *A_small;
  container_t *BM_1;
  int cm12;
  int x_4;
  int randstate;
  int x_3;
  int x_2;
  int x_1;
  int x;
  run_container_t *R4;
  run_container_t *R3;
  run_container_t *R2;
  run_container_t *R1;
  bitset_container_t *BM;
  bitset_container_t *B4;
  bitset_container_t *B3;
  bitset_container_t *B2;
  bitset_container_t *B1;
  array_container_t *AM;
  array_container_t *A4;
  array_container_t *A3;
  array_container_t *A2;
  array_container_t *A1;
  undefined4 in_stack_fffffffffffffee8;
  undefined2 in_stack_fffffffffffffeec;
  uint16_t in_stack_fffffffffffffeee;
  array_container_t *in_stack_fffffffffffffef0;
  run_container_t *in_stack_fffffffffffffef8;
  array_container_t *in_stack_ffffffffffffff00;
  run_container_t *in_stack_ffffffffffffff08;
  array_container_t *in_stack_ffffffffffffff10;
  undefined4 local_dc;
  undefined4 in_stack_ffffffffffffff28;
  int iVar2;
  undefined4 in_stack_ffffffffffffff2c;
  int iVar3;
  undefined4 in_stack_ffffffffffffff30;
  int iVar4;
  undefined4 in_stack_ffffffffffffff34;
  int iVar5;
  run_container_t *in_stack_ffffffffffffff38;
  array_container_t *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int iVar6;
  undefined4 local_a4;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  
  array_container_create();
  array_container_create();
  array_container_create();
  array_container_create();
  array = array_container_create();
  bitset = bitset_container_create();
  bitset_00 = bitset_container_create();
  bitset_01 = bitset_container_create();
  bitset_02 = bitset_container_create();
  bitset_03 = bitset_container_create();
  run_container_create();
  run_container_create();
  run_container_create();
  run_container_create();
  for (local_74 = 0; local_74 < 0x10000; local_74 = local_74 + 1) {
    if (local_74 % 5 < 3) {
      array_container_add(in_stack_fffffffffffffef0,in_stack_fffffffffffffeee);
      bitset_container_set(bitset,(uint16_t)local_74);
      run_container_add(in_stack_fffffffffffffef8,
                        (uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30));
    }
  }
  for (local_78 = 0; local_78 < 0x10000; local_78 = local_78 + 1) {
    if (local_78 % 0x3e < 0x25) {
      array_container_add(in_stack_fffffffffffffef0,in_stack_fffffffffffffeee);
      bitset_container_set(bitset_00,(uint16_t)local_78);
      run_container_add(in_stack_fffffffffffffef8,
                        (uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30));
    }
  }
  for (local_7c = 0; local_7c < 0x10000; local_7c = local_7c + 1) {
    if ((local_7c % 5 < 3) && (0x24 < local_7c % 0x3e)) {
      array_container_add(in_stack_fffffffffffffef0,in_stack_fffffffffffffeee);
      bitset_container_set(bitset_03,(uint16_t)local_7c);
    }
  }
  for (local_80 = 0; local_80 < 0x10000; local_80 = local_80 + 1) {
    if ((local_80 % 5 < 2) || ((local_80 % 5 < 3 && (10000 < local_80)))) {
      array_container_add(in_stack_fffffffffffffef0,in_stack_fffffffffffffeee);
      bitset_container_set(bitset_01,(uint16_t)local_80);
      run_container_add(in_stack_fffffffffffffef8,
                        (uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30));
    }
  }
  local_84 = 1;
  for (local_88 = 0; local_88 < 0x10000; local_88 = local_88 + 1) {
    if (local_84 % 4 != 0) {
      run_container_add(in_stack_fffffffffffffef8,
                        (uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30));
      array_container_add(in_stack_fffffffffffffef0,in_stack_fffffffffffffeee);
      bitset_container_add(bitset_02,(uint16_t)local_88);
    }
    local_84 = (local_84 * 0xd68 + 0x1a85) % 0x26f5;
  }
  iVar1 = array_container_cardinality(array);
  run_bitset_container_andnot
            (in_stack_ffffffffffffff38,
             (bitset_container_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (container_t **)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  _assert_true((unsigned_long)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
               (char *)in_stack_fffffffffffffef0,
               CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  array_container_cardinality((array_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  array_container_free((array_container_t *)0x1060e0);
  array_run_container_andnot
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  array_container_cardinality(array);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  run_run_container_andnot
            ((run_container_t *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (container_t **)in_stack_fffffffffffffef0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  run_container_cardinality
            ((run_container_t *)
             CONCAT26(in_stack_fffffffffffffeee,
                      CONCAT24(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)));
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  run_container_free((run_container_t *)0x106196);
  run_bitset_container_andnot
            (in_stack_ffffffffffffff38,
             (bitset_container_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (container_t **)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  _assert_true((unsigned_long)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
               (char *)in_stack_fffffffffffffef0,
               CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  array_container_cardinality((array_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  array_container_free((array_container_t *)0x106214);
  bitset_run_container_andnot
            ((bitset_container_t *)in_stack_ffffffffffffff08,
             (run_container_t *)in_stack_ffffffffffffff00,(container_t **)in_stack_fffffffffffffef8)
  ;
  _assert_true((unsigned_long)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
               (char *)in_stack_fffffffffffffef0,
               CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  array_container_cardinality((array_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  array_container_free((array_container_t *)0x106292);
  array_run_container_andnot
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  array_container_cardinality(array);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  run_array_container_andnot
            ((run_container_t *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             in_stack_ffffffffffffff40,(container_t **)in_stack_ffffffffffffff38);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  array_container_cardinality((array_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  array_container_free((array_container_t *)0x10634a);
  run_run_container_andnot
            ((run_container_t *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (container_t **)in_stack_fffffffffffffef0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  array_container_cardinality((array_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  array_container_free((array_container_t *)0x1063bf);
  run_bitset_container_andnot
            (in_stack_ffffffffffffff38,
             (bitset_container_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (container_t **)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  _assert_true((unsigned_long)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
               (char *)in_stack_fffffffffffffef0,
               CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  src_1 = (array_container_t *)(long)iVar1;
  bitset_container_cardinality((bitset_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  bitset_container_free((bitset_container_t *)0x106447);
  array_run_container_andnot(src_1,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  array_container_cardinality(array);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  array_container_create();
  for (local_a4 = 0x3de; local_a4 < 1000; local_a4 = local_a4 + 1) {
    array_container_add(in_stack_fffffffffffffef0,in_stack_fffffffffffffeee);
  }
  run_container_create();
  for (iVar6 = 0x3de; iVar6 < 1000; iVar6 = iVar6 + 1) {
    run_container_add(in_stack_fffffffffffffef8,(uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30)
                     );
  }
  array_run_container_andnot(src_1,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  array_container_cardinality(array);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  run_bitset_container_andnot
            (in_stack_ffffffffffffff38,
             (bitset_container_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (container_t **)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  _assert_true((unsigned_long)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
               (char *)in_stack_fffffffffffffef0,
               CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  array_container_cardinality((array_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  array_container_free((array_container_t *)0x1065c6);
  run_array_container_andnot
            ((run_container_t *)CONCAT44(iVar6,in_stack_ffffffffffffff48),in_stack_ffffffffffffff40,
             (container_t **)in_stack_ffffffffffffff38);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  run_container_cardinality
            ((run_container_t *)
             CONCAT26(in_stack_fffffffffffffeee,
                      CONCAT24(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)));
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  run_container_free((run_container_t *)0x106638);
  src_2 = (array_container_t *)run_container_create();
  src_1_00 = array_container_create();
  for (iVar5 = 0; iVar5 < 3; iVar5 = iVar5 + 1) {
    run_container_add(in_stack_fffffffffffffef8,(uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30)
                     );
  }
  for (iVar4 = 10; iVar4 < 0xc; iVar4 = iVar4 + 1) {
    run_container_add(in_stack_fffffffffffffef8,(uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30)
                     );
  }
  for (iVar3 = 0x3de; iVar3 < 0x3e3; iVar3 = iVar3 + 1) {
    run_container_add(in_stack_fffffffffffffef8,(uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30)
                     );
  }
  for (iVar2 = 10000; iVar2 < 0x2713; iVar2 = iVar2 + 1) {
    run_container_add(in_stack_fffffffffffffef8,(uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30)
                     );
  }
  for (local_dc = 20000; local_dc < 0x4e22; local_dc = local_dc + 1) {
    run_container_add(in_stack_fffffffffffffef8,(uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30)
                     );
  }
  array_container_add(in_stack_fffffffffffffef0,in_stack_fffffffffffffeee);
  array_container_add(in_stack_fffffffffffffef0,in_stack_fffffffffffffeee);
  array_container_add(in_stack_fffffffffffffef0,in_stack_fffffffffffffeee);
  run_array_container_andnot
            ((run_container_t *)CONCAT44(iVar6,in_stack_ffffffffffffff48),src_2,
             (container_t **)src_1_00);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  run_container_cardinality
            ((run_container_t *)
             CONCAT26(in_stack_fffffffffffffeee,
                      CONCAT24(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)));
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  array_container_free((array_container_t *)0x1067d2);
  array_container_free((array_container_t *)0x1067e8);
  run_container_free((run_container_t *)0x1067f2);
  run_array_container_andnot
            ((run_container_t *)CONCAT44(iVar6,in_stack_ffffffffffffff48),src_2,
             (container_t **)src_1_00);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  array_container_cardinality((array_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  array_container_free((array_container_t *)0x10685b);
  run_run_container_andnot
            ((run_container_t *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (container_t **)in_stack_fffffffffffffef0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  dst = (container_t **)(long)iVar1;
  bitset_container_cardinality((bitset_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,
                    (unsigned_long)in_stack_fffffffffffffef8,(char *)dst,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  bitset_container_free((bitset_container_t *)0x1068dd);
  bitset_bitset_container_andnot
            ((bitset_container_t *)in_stack_ffffffffffffff08,
             (bitset_container_t *)in_stack_ffffffffffffff00,
             (container_t **)in_stack_fffffffffffffef8);
  _assert_true((unsigned_long)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
               (char *)dst,CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  iVar1 = bitset_container_cardinality((bitset_container_t *)0x0);
  bitset_container_free((bitset_container_t *)0x106943);
  run_bitset_container_andnot
            ((run_container_t *)src_1_00,(bitset_container_t *)CONCAT44(iVar5,iVar4),
             (container_t **)CONCAT44(iVar3,iVar2));
  _assert_true((unsigned_long)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
               (char *)dst,CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  src_2_00 = (run_container_t *)(long)iVar1;
  bitset_container_cardinality((bitset_container_t *)0x0);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff00,(unsigned_long)src_2_00,(char *)dst,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  bitset_container_free((bitset_container_t *)0x1069c8);
  array_run_container_andnot(src_1,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  src_1_01 = (run_container_t *)(long)iVar1;
  array_container_cardinality(array);
  _assert_int_equal((unsigned_long)src_1_01,(unsigned_long)src_2_00,(char *)dst,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  run_run_container_andnot(src_1_01,src_2_00,dst);
  _assert_int_equal((unsigned_long)src_1_01,(unsigned_long)src_2_00,(char *)dst,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  bitset_container_cardinality((bitset_container_t *)0x0);
  _assert_int_equal((unsigned_long)src_1_01,(unsigned_long)src_2_00,(char *)dst,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  bitset_container_free((bitset_container_t *)0x106a94);
  array_container_free((array_container_t *)0x106aad);
  array_container_free((array_container_t *)0x106aba);
  array_container_free((array_container_t *)0x106ac7);
  array_container_free((array_container_t *)0x106ad4);
  array_container_free((array_container_t *)0x106ae1);
  array_container_free((array_container_t *)0x106aeb);
  bitset_container_free((bitset_container_t *)0x106af8);
  bitset_container_free((bitset_container_t *)0x106b05);
  bitset_container_free((bitset_container_t *)0x106b12);
  bitset_container_free((bitset_container_t *)0x106b1f);
  bitset_container_free((bitset_container_t *)0x106b2c);
  run_container_free((run_container_t *)0x106b39);
  run_container_free((run_container_t *)0x106b46);
  run_container_free((run_container_t *)0x106b53);
  run_container_free((run_container_t *)0x106b60);
  run_container_free((run_container_t *)0x106b6a);
  return;
}

Assistant:

DEFINE_TEST(run_andnot_test) {
    array_container_t* A1 = array_container_create();
    array_container_t* A2 = array_container_create();
    array_container_t* A3 = array_container_create();
    array_container_t* A4 = array_container_create();
    array_container_t* AM = array_container_create();
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* B3 = bitset_container_create();
    bitset_container_t* B4 = bitset_container_create();
    bitset_container_t* BM = bitset_container_create();
    run_container_t* R1 = run_container_create();
    run_container_t* R2 = run_container_create();
    run_container_t* R3 = run_container_create();
    run_container_t* R4 = run_container_create();

    // B/A1 minus  R1 is empty (array or run, I guess)
    // B/A1 minus R2 is probably best left as runs
    // B/A3 minus R1 is best as an array.
    // B/A3 minus R4 is best as a bitmap

    // nb, array containers will be illegally big.
    for (int x = 0; x < (1 << 16); x++) {
        if (x % 5 < 3) {
            array_container_add(A1, x);
            bitset_container_set(B1, x);
            run_container_add(R1, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++) {
        if (x % 62 < 37) {
            array_container_add(A2, x);
            bitset_container_set(B2, x);
            run_container_add(R2, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++)
        if ((x % 5 < 3) && !(x % 62 < 37)) {
            array_container_add(AM, x);
            bitset_container_set(BM, x);
        }

    // the elements x%5 == 2 differ for less than 10k, otherwise same)
    for (int x = 0; x < (1 << 16); x++) {
        if ((x % 5 < 2) || ((x % 5 < 3) && (x > 10000))) {
            array_container_add(A3, x);
            bitset_container_set(B3, x);
            run_container_add(R3, x);
        }
    }

    int randstate = 1;  // for Oakenfull RNG, hope LSBits are nice
    for (int x = 0; x < (1 << 16); x++) {
        if (randstate % 4) {
            run_container_add(R4, x);
            array_container_add(A4, x);
            bitset_container_add(B4, x);
        }
        randstate = (3432 * randstate + 6789) % 9973;
    }

    int cm12 = array_container_cardinality(AM);

    container_t* BM_1 = NULL;

    assert_false(run_bitset_container_andnot(R1, B1, &BM_1));
    assert_int_equal(0, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    array_run_container_andnot(A1, R1, AM);
    assert_int_equal(0, array_container_cardinality(AM));

    // both run coding and array coding have same serialized size for
    // empty
    assert_int_equal(RUN_CONTAINER_TYPE,
                     run_run_container_andnot(R1, R1, &BM_1));
    assert_int_equal(0, run_container_cardinality(CAST_run(BM_1)));
    run_container_free(CAST_run(BM_1));
    BM_1 = NULL;

    assert_false(run_bitset_container_andnot(R1, B3, &BM_1));
    assert_int_equal(2000, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    assert_false(bitset_run_container_andnot(B1, R3, &BM_1));
    assert_int_equal(2000, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    array_run_container_andnot(A1, R3, AM);
    assert_int_equal(2000, array_container_cardinality(AM));

    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_array_container_andnot(R1, A3, &BM_1));
    assert_int_equal(2000, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_run_container_andnot(R1, R3, &BM_1));
    assert_int_equal(2000, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    assert_true(run_bitset_container_andnot(R1, B2, &BM_1));
    assert_int_equal(cm12, bitset_container_cardinality(CAST_bitset(BM_1)));
    bitset_container_free(CAST_bitset(BM_1));
    BM_1 = NULL;

    array_run_container_andnot(A1, R2, AM);
    assert_int_equal(cm12, array_container_cardinality(AM));

    array_container_t* A_small = array_container_create();
    for (int i = 990; i < 1000; ++i) array_container_add(A_small, i);

    run_container_t* R_small = run_container_create();
    for (int i = 990; i < 1000; ++i) run_container_add(R_small, i);

    array_run_container_andnot(A_small, R2, AM);
    assert_int_equal(2,                                 // something like that
                     array_container_cardinality(AM));  // hopefully right...

    assert_false(run_bitset_container_andnot(R_small, B2, &BM_1));
    assert_int_equal(2, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    // note, result is equally small as an array or a run
    assert_int_equal(RUN_CONTAINER_TYPE,
                     run_array_container_andnot(R_small, A2, &BM_1));
    assert_int_equal(2, run_container_cardinality(CAST_run(BM_1)));
    run_container_free(CAST_run(BM_1));
    BM_1 = NULL;

    // test with more complicated small run structure (to do)
    run_container_t* R_small_complex = run_container_create();
    array_container_t* temp_ac = array_container_create();

    for (int i = 0; i < 3; ++i) run_container_add(R_small_complex, i);
    for (int i = 10; i < 12; ++i) run_container_add(R_small_complex, i);
    for (int i = 990; i < 995; ++i) run_container_add(R_small_complex, i);
    for (int i = 10000; i < 10003; ++i) run_container_add(R_small_complex, i);
    for (int i = 20000; i < 20002; ++i) run_container_add(R_small_complex, i);

    array_container_add(temp_ac, 993);
    array_container_add(temp_ac, 994);
    array_container_add(temp_ac, 2000);

    assert_int_equal(RUN_CONTAINER_TYPE, run_array_container_andnot(
                                             R_small_complex, temp_ac, &BM_1));
    assert_int_equal(13, run_container_cardinality(CAST_run(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    array_container_free(temp_ac);
    run_container_free(R_small_complex);

    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_array_container_andnot(R1, A3, &BM_1));
    assert_int_equal(2000, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_run_container_andnot(R1, R2, &BM_1));
    assert_int_equal(cm12, bitset_container_cardinality(CAST_bitset(BM_1)));
    bitset_container_free(CAST_bitset(BM_1));
    BM_1 = NULL;

    // compute the true card for cont4 - cont3 assuming that
    // bitset-bitset implementation is known correct
    assert_true(bitset_bitset_container_andnot(B4, B3, &BM_1));
    int card_4_3 = bitset_container_cardinality(CAST_bitset(BM_1));
    bitset_container_free(CAST_bitset(BM_1));
    BM_1 = NULL;

    assert_true(run_bitset_container_andnot(R4, B3, &BM_1));
    assert_int_equal(card_4_3, bitset_container_cardinality(CAST_bitset(BM_1)));
    bitset_container_free(CAST_bitset(BM_1));
    BM_1 = NULL;

    array_run_container_andnot(A4, R3, AM);
    // if this fails, either this bitset is wrong or the previous one...
    assert_int_equal(card_4_3, array_container_cardinality(AM));

    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_run_container_andnot(R4, R3, &BM_1));
    assert_int_equal(card_4_3, bitset_container_cardinality(CAST_bitset(BM_1)));
    bitset_container_free(CAST_bitset(BM_1));
    BM_1 = NULL;

    array_container_free(A1);
    array_container_free(A2);
    array_container_free(A3);
    array_container_free(A4);
    array_container_free(AM);
    array_container_free(A_small);

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(B3);
    bitset_container_free(B4);
    bitset_container_free(BM);

    run_container_free(R1);
    run_container_free(R2);
    run_container_free(R3);
    run_container_free(R4);
    run_container_free(R_small);
}